

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ushort *puVar4;
  long *plVar5;
  Nonnull<const_char_*> pcVar6;
  undefined8 extraout_RAX;
  size_t in_R9;
  long *v2;
  string_view format;
  ulong local_48;
  long local_40;
  ulong local_38;
  long local_30;
  
  lVar3 = **(long **)this;
  iVar1 = **(int **)(this + 8);
  v2 = (long *)((long)iVar1 + -1);
  if ((long)iVar1 < 1) {
    pcVar6 = log_internal::MakeCheckOpString<long,long>(0,(long)v2,"0 <= index");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    iVar2 = *(int *)(lVar3 + 8);
    v2 = (long *)(long)(int)v2;
    if (iVar2 < iVar1) {
      pcVar6 = log_internal::MakeCheckOpString<long,long>
                         ((long)v2,(long)iVar2,"index < field_count()");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      puVar4 = *(ushort **)(*(long *)(lVar3 + 0x40) + 8 + (long)v2 * 0x58);
      local_48 = (ulong)*puVar4;
      local_38 = (ulong)**(ushort **)(**(long **)(this + 0x10) + 8);
      local_40 = ~local_48 + (long)puVar4;
      local_30 = ~local_38 + (long)*(ushort **)(**(long **)(this + 0x10) + 8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      format._M_str = (char *)&local_48;
      format._M_len =
           (size_t)
           "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
      ;
      substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x82,format,
                 (Nullable<const_absl::string_view_*>)0x2,in_R9);
      return __return_storage_ptr__;
    }
  }
  else {
    InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
              ();
  }
  InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
            ();
  plVar5 = (long *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (plVar5 != v2) {
    operator_delete(plVar5,*v2 + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}